

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationDataBuilder::maybeSetPrimaryRange
          (CollationDataBuilder *this,UChar32 start,UChar32 end,uint32_t primary,int32_t step,
          UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  int32_t index_00;
  uint32_t value;
  uint32_t offsetCE32;
  int32_t index;
  int64_t dataCE;
  int32_t blockDelta;
  UErrorCode *errorCode_local;
  int32_t step_local;
  uint32_t primary_local;
  UChar32 end_local;
  UChar32 start_local;
  CollationDataBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    iVar2 = (end >> 5) - (start >> 5);
    if (((step < 2) || (0x7f < step)) ||
       ((iVar2 < 3 && (((iVar2 < 1 || (0x1c < (start & 0x1fU))) || ((end & 0x1fU) < 3)))))) {
      this_local._7_1_ = '\0';
    }
    else {
      _offsetCE32 = (ulong)primary << 0x20 | (long)(start << 8) | (long)step;
      UVar1 = isCompressiblePrimary(this,primary);
      if (UVar1 != '\0') {
        _offsetCE32 = _offsetCE32 | 0x80;
      }
      index_00 = addCE(this,_offsetCE32,errorCode);
      UVar1 = ::U_FAILURE(*errorCode);
      if (UVar1 == '\0') {
        if (index_00 < 0x80000) {
          value = Collation::makeCE32FromTagAndIndex(0xe,index_00);
          utrie2_setRange32_63(this->trie,start,end,value,'\x01',errorCode);
          this->modified = '\x01';
          this_local._7_1_ = '\x01';
        }
        else {
          *errorCode = U_BUFFER_OVERFLOW_ERROR;
          this_local._7_1_ = '\0';
        }
      }
      else {
        this_local._7_1_ = '\0';
      }
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool
CollationDataBuilder::maybeSetPrimaryRange(UChar32 start, UChar32 end,
                                           uint32_t primary, int32_t step,
                                           UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    U_ASSERT(start <= end);
    // TODO: Do we need to check what values are currently set for start..end?
    // An offset range is worth it only if we can achieve an overlap between
    // adjacent UTrie2 blocks of 32 code points each.
    // An offset CE is also a little more expensive to look up and compute
    // than a simple CE.
    // If the range spans at least three UTrie2 block boundaries (> 64 code points),
    // then we take it.
    // If the range spans one or two block boundaries and there are
    // at least 4 code points on either side, then we take it.
    // (We could additionally require a minimum range length of, say, 16.)
    int32_t blockDelta = (end >> 5) - (start >> 5);
    if(2 <= step && step <= 0x7f &&
            (blockDelta >= 3 ||
            (blockDelta > 0 && (start & 0x1f) <= 0x1c && (end & 0x1f) >= 3))) {
        int64_t dataCE = ((int64_t)primary << 32) | (start << 8) | step;
        if(isCompressiblePrimary(primary)) { dataCE |= 0x80; }
        int32_t index = addCE(dataCE, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        if(index > Collation::MAX_INDEX) {
            errorCode = U_BUFFER_OVERFLOW_ERROR;
            return 0;
        }
        uint32_t offsetCE32 = Collation::makeCE32FromTagAndIndex(Collation::OFFSET_TAG, index);
        utrie2_setRange32(trie, start, end, offsetCE32, TRUE, &errorCode);
        modified = TRUE;
        return TRUE;
    } else {
        return FALSE;
    }
}